

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O3

void __thiscall
embree::avx::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  undefined8 *puVar1;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar2;
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar3;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  vfloat_impl<4> *pvVar8;
  vfloat_impl<4> *pvVar9;
  vfloat_impl<4> *pvVar10;
  vfloat_impl<4> *pvVar11;
  vfloat_impl<4> *pvVar12;
  vfloat_impl<4> *pvVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ulong uVar23;
  long *plVar24;
  long lVar25;
  long lVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  ulong uVar28;
  long *plVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  float fVar36;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float t1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  float t0;
  float fVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  undefined1 auVar46 [16];
  float B0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  vfloat_impl<4> f3_p_3;
  float fVar71;
  vfloat_impl<4> f3_p;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 in_ZMM10 [64];
  float fVar75;
  float fVar76;
  float fVar77;
  vfloat_impl<4> f3_p_1;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  vfloat_impl<4> f3_p_2;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  undefined1 local_3500 [8];
  undefined8 uStack_34f8;
  undefined1 local_34f0 [8];
  undefined8 uStack_34e8;
  float fStack_34cc;
  undefined1 local_34c0 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3440;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33c0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33b0;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3380;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  long local_3180 [320];
  undefined8 local_2780 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_2740;
  undefined8 local_26c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_2680 [5];
  undefined8 local_1a80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_1a40;
  undefined8 local_19c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_1980 [5];
  undefined8 local_d80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_d40;
  undefined8 local_cc0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_c80 [4];
  undefined1 local_380 [768];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_80 [5];
  
  local_34c0._4_4_ = in_XMM0_Db;
  local_34c0._0_4_ = dscale;
  local_34c0._8_4_ = in_XMM0_Dc;
  local_34c0._12_4_ = in_XMM0_Dd;
  uStack_34f8 = 0x8000000000000000;
  local_3500 = (undefined1  [8])0x8000000000000000;
  uStack_34e8 = 1;
  local_34f0 = (undefined1  [8])0x1;
  while( true ) {
    auVar42 = in_ZMM10._0_16_;
    uVar5 = (patch->ring).items[0].face_valence;
    uVar23 = (ulong)uVar5;
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar23 - 1;
      auVar37 = vpshufd_avx(auVar37,0x44);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = 0;
      auVar42 = vpcmpeqd_avx(auVar42,auVar42);
      do {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar28;
        auVar46 = vpshufd_avx(auVar46,0x44);
        auVar52._16_16_ = auVar46;
        auVar52._0_16_ = auVar46;
        auVar52 = vorps_avx(_DAT_01fb0e40,auVar52);
        auVar49 = vpcmpgtq_avx(_local_3500 ^ auVar52._16_16_,_local_3500 ^ auVar37);
        auVar46 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
        auVar46 = vpackssdw_avx(auVar46,auVar49);
        auVar46 = vmaskmovps_avx(auVar42 ^ auVar46,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[0].crease_weight.data + uVar28));
        auVar50 = auVar43._0_16_;
        auVar46 = vcmpps_avx(ZEXT816(0) << 0x40,auVar46,1);
        auVar39 = vshufps_avx(auVar46,auVar46,0xd4);
        auVar46 = vshufps_avx(auVar46,auVar46,0xfa);
        auVar46 = vandps_avx(_local_34f0,auVar46);
        auVar40 = auVar43._16_16_;
        auVar38 = vpaddq_avx(auVar40,auVar46);
        auVar46 = vandps_avx(_local_34f0,auVar39);
        auVar46 = vpaddq_avx(auVar50,auVar46);
        auVar43 = ZEXT3264(CONCAT1616(auVar38,auVar46));
        uVar28 = uVar28 + 4;
      } while ((uVar23 + 3 & 0x1fffffffc) != uVar28);
      auVar39 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
      auVar37 = vblendvpd_avx(auVar38,auVar40,auVar49);
      auVar46 = vblendvpd_avx(auVar46,auVar50,auVar39);
      auVar37 = vpaddq_avx(auVar46,auVar37);
      auVar46 = vpshufd_avx(auVar37,0xee);
      auVar37 = vpaddq_avx(auVar37,auVar46);
      uVar23 = auVar37._0_8_;
    }
    iVar6 = (patch->ring).items[0].border_index;
    bVar32 = uVar23 == (uint)(iVar6 != -1) * 2;
    bVar21 = true;
    fVar36 = (patch->ring).items[0].vertex_crease_weight;
    bVar14 = bVar32;
    bVar15 = bVar21;
    if (uVar5 == 2 && iVar6 != -1) {
      if (((fVar36 != 0.0) || (NAN(fVar36))) && (fVar36 < INFINITY)) {
        bVar14 = false;
        bVar15 = false;
      }
    }
    else {
      bVar14 = false;
      bVar15 = false;
      if (((fVar36 == 0.0) && (!NAN(fVar36))) &&
         (bVar14 = bVar32, bVar15 = bVar21, uVar5 != 3 || iVar6 == -1)) {
        bVar14 = (uVar5 == 4 && iVar6 == -1) && bVar32;
        bVar15 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[1].face_valence;
    uVar23 = (ulong)uVar5;
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar23 - 1;
      auVar37 = vpshufd_avx(auVar38,0x44);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = 0;
      auVar42 = vpcmpeqd_avx(auVar42,auVar42);
      do {
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar28;
        auVar46 = vpshufd_avx(auVar49,0x44);
        auVar53._16_16_ = auVar46;
        auVar53._0_16_ = auVar46;
        auVar52 = vorps_avx(_DAT_01fb0e40,auVar53);
        auVar49 = vpcmpgtq_avx(_local_3500 ^ auVar52._16_16_,_local_3500 ^ auVar37);
        auVar46 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
        auVar46 = vpackssdw_avx(auVar46,auVar49);
        auVar46 = vmaskmovps_avx(auVar42 ^ auVar46,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[1].crease_weight.data + uVar28));
        auVar50 = auVar43._0_16_;
        auVar46 = vcmpps_avx(ZEXT816(0) << 0x40,auVar46,1);
        auVar39 = vshufps_avx(auVar46,auVar46,0xd4);
        auVar46 = vshufps_avx(auVar46,auVar46,0xfa);
        auVar46 = vandps_avx(_local_34f0,auVar46);
        auVar40 = auVar43._16_16_;
        auVar38 = vpaddq_avx(auVar40,auVar46);
        auVar46 = vandps_avx(_local_34f0,auVar39);
        auVar46 = vpaddq_avx(auVar50,auVar46);
        auVar43 = ZEXT3264(CONCAT1616(auVar38,auVar46));
        uVar28 = uVar28 + 4;
      } while ((uVar23 + 3 & 0x1fffffffc) != uVar28);
      auVar39 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
      auVar37 = vblendvpd_avx(auVar38,auVar40,auVar49);
      auVar46 = vblendvpd_avx(auVar46,auVar50,auVar39);
      auVar37 = vpaddq_avx(auVar46,auVar37);
      auVar46 = vpshufd_avx(auVar37,0xee);
      auVar37 = vpaddq_avx(auVar37,auVar46);
      uVar23 = auVar37._0_8_;
    }
    iVar6 = (patch->ring).items[1].border_index;
    bVar33 = uVar23 == (uint)(iVar6 != -1) * 2;
    bVar20 = true;
    fVar36 = (patch->ring).items[1].vertex_crease_weight;
    bVar21 = bVar33;
    bVar32 = bVar20;
    if (uVar5 == 2 && iVar6 != -1) {
      if (((fVar36 != 0.0) || (NAN(fVar36))) && (fVar36 < INFINITY)) {
        bVar21 = false;
        bVar32 = false;
      }
    }
    else {
      bVar21 = false;
      bVar32 = false;
      if (((fVar36 == 0.0) && (!NAN(fVar36))) &&
         (bVar21 = bVar33, bVar32 = bVar20, uVar5 != 3 || iVar6 == -1)) {
        bVar21 = (uVar5 == 4 && iVar6 == -1) && bVar33;
        bVar32 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[2].face_valence;
    uVar23 = (ulong)uVar5;
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar23 - 1;
      auVar37 = vpshufd_avx(auVar39,0x44);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = 0;
      auVar42 = vpcmpeqd_avx(auVar42,auVar42);
      do {
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar28;
        auVar46 = vpshufd_avx(auVar50,0x44);
        auVar54._16_16_ = auVar46;
        auVar54._0_16_ = auVar46;
        auVar52 = vorps_avx(_DAT_01fb0e40,auVar54);
        auVar49 = vpcmpgtq_avx(_local_3500 ^ auVar52._16_16_,_local_3500 ^ auVar37);
        auVar46 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
        auVar46 = vpackssdw_avx(auVar46,auVar49);
        auVar46 = vmaskmovps_avx(auVar42 ^ auVar46,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[2].crease_weight.data + uVar28));
        auVar50 = auVar43._0_16_;
        auVar46 = vcmpps_avx(ZEXT816(0) << 0x40,auVar46,1);
        auVar39 = vshufps_avx(auVar46,auVar46,0xd4);
        auVar46 = vshufps_avx(auVar46,auVar46,0xfa);
        auVar46 = vandps_avx(_local_34f0,auVar46);
        auVar40 = auVar43._16_16_;
        auVar38 = vpaddq_avx(auVar40,auVar46);
        auVar46 = vandps_avx(_local_34f0,auVar39);
        auVar46 = vpaddq_avx(auVar50,auVar46);
        auVar43 = ZEXT3264(CONCAT1616(auVar38,auVar46));
        uVar28 = uVar28 + 4;
      } while ((uVar23 + 3 & 0x1fffffffc) != uVar28);
      auVar39 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
      auVar37 = vblendvpd_avx(auVar38,auVar40,auVar49);
      auVar46 = vblendvpd_avx(auVar46,auVar50,auVar39);
      auVar37 = vpaddq_avx(auVar46,auVar37);
      auVar46 = vpshufd_avx(auVar37,0xee);
      auVar37 = vpaddq_avx(auVar37,auVar46);
      uVar23 = auVar37._0_8_;
    }
    iVar6 = (patch->ring).items[2].border_index;
    bVar34 = uVar23 == (uint)(iVar6 != -1) * 2;
    bVar19 = true;
    fVar36 = (patch->ring).items[2].vertex_crease_weight;
    bVar20 = bVar34;
    bVar33 = bVar19;
    if (uVar5 == 2 && iVar6 != -1) {
      if (((fVar36 != 0.0) || (NAN(fVar36))) && (fVar36 < INFINITY)) {
        bVar20 = false;
        bVar33 = false;
      }
    }
    else {
      bVar20 = false;
      bVar33 = false;
      if (((fVar36 == 0.0) && (!NAN(fVar36))) &&
         (bVar20 = bVar34, bVar33 = bVar19, uVar5 != 3 || iVar6 == -1)) {
        bVar20 = (uVar5 == 4 && iVar6 == -1) && bVar34;
        bVar33 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[3].face_valence;
    uVar23 = (ulong)uVar5;
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar23 - 1;
      auVar37 = vpshufd_avx(auVar40,0x44);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = 0;
      auVar42 = vpcmpeqd_avx(auVar42,auVar42);
      do {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar28;
        auVar46 = vpshufd_avx(auVar51,0x44);
        auVar55._16_16_ = auVar46;
        auVar55._0_16_ = auVar46;
        auVar52 = vorps_avx(_DAT_01fb0e40,auVar55);
        auVar49 = vpcmpgtq_avx(_local_3500 ^ auVar52._16_16_,_local_3500 ^ auVar37);
        auVar46 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
        auVar46 = vpackssdw_avx(auVar46,auVar49);
        auVar46 = vmaskmovps_avx(auVar42 ^ auVar46,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[3].crease_weight.data + uVar28));
        auVar50 = auVar43._0_16_;
        auVar46 = vcmpps_avx(ZEXT816(0) << 0x40,auVar46,1);
        auVar39 = vshufps_avx(auVar46,auVar46,0xd4);
        auVar46 = vshufps_avx(auVar46,auVar46,0xfa);
        auVar46 = vandps_avx(_local_34f0,auVar46);
        auVar40 = auVar43._16_16_;
        auVar38 = vpaddq_avx(auVar40,auVar46);
        auVar46 = vandps_avx(_local_34f0,auVar39);
        auVar46 = vpaddq_avx(auVar50,auVar46);
        auVar43 = ZEXT3264(CONCAT1616(auVar38,auVar46));
        uVar28 = uVar28 + 4;
      } while ((uVar23 + 3 & 0x1fffffffc) != uVar28);
      auVar39 = vpcmpgtq_avx(_local_3500 ^ auVar52._0_16_,_local_3500 ^ auVar37);
      auVar37 = vblendvpd_avx(auVar38,auVar40,auVar49);
      auVar46 = vblendvpd_avx(auVar46,auVar50,auVar39);
      auVar37 = vpaddq_avx(auVar46,auVar37);
      auVar46 = vpshufd_avx(auVar37,0xee);
      auVar37 = vpaddq_avx(auVar37,auVar46);
      uVar23 = auVar37._0_8_;
    }
    iVar6 = (patch->ring).items[3].border_index;
    bVar35 = uVar23 == (uint)(iVar6 != -1) * 2;
    bVar22 = true;
    fVar36 = (patch->ring).items[3].vertex_crease_weight;
    bVar19 = bVar35;
    bVar34 = bVar22;
    if (uVar5 == 2 && iVar6 != -1) {
      if (((fVar36 != 0.0) || (NAN(fVar36))) && (fVar36 < INFINITY)) {
        bVar19 = false;
        bVar34 = false;
      }
    }
    else {
      bVar19 = false;
      bVar34 = false;
      if (((fVar36 == 0.0) && (!NAN(fVar36))) &&
         (bVar19 = bVar35, bVar34 = bVar22, uVar5 != 3 || iVar6 == -1)) {
        bVar19 = (uVar5 == 4 && iVar6 == -1) && bVar35;
        bVar34 = uVar5 == 4 && iVar6 == -1;
      }
    }
    if (9 < depth) break;
    if ((bool)(bVar21 & bVar14 & bVar20 & bVar19)) goto LAB_014fd036;
    plVar24 = local_3180;
    lVar25 = 0;
    do {
      lVar26 = 0xd00;
      plVar29 = plVar24;
      do {
        plVar29[-0x50] = (long)(plVar29 + -0x58);
        plVar29[-0x47] = 0;
        *plVar29 = (long)(plVar29 + -0x40);
        plVar29 = plVar29 + 0x68;
        lVar26 = lVar26 + -0x340;
      } while (lVar26 != 0);
      lVar25 = lVar25 + 0xd00;
      plVar24 = plVar24 + 0x1a0;
    } while (lVar25 != 0x3400);
    in_ZMM10 = ZEXT1664(auVar42);
    CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
              (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                      *)&local_3480);
    aVar3 = (uv->field_0).field_0;
    auVar42._8_8_ = 0;
    auVar42._0_4_ = aVar3.x;
    auVar42._4_4_ = aVar3.y;
    auVar42 = vmovshdup_avx(auVar42);
    fVar44 = auVar42._0_4_;
    fVar36 = aVar3.x;
    fStack_34cc = aVar3.y;
    if (0.5 <= fVar44) {
      if (fVar36 <= 0.5) {
        lVar25 = 0;
        do {
          uVar18 = *(undefined8 *)((long)local_d80 + lVar25 + 8);
          puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar25 + -0x40);
          *puVar1 = *(undefined8 *)((long)local_d80 + lVar25);
          puVar1[1] = uVar18;
          DynamicStackArray<float,_16UL,_64UL>::operator=
                    ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                     (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_d40.arr + lVar25));
          uVar18 = *(undefined8 *)((long)local_cc0 + lVar25 + 8);
          pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar25);
          pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_cc0 + lVar25);
          *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
          uVar18 = *(undefined8 *)((long)local_cc0 + lVar25 + 0x18);
          *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_cc0 + lVar25 + 0x10);
          *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                    (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                            ((long)&aDStack_c80[0].arr[0].field_0 + lVar25));
          lVar25 = lVar25 + 0x340;
        } while (lVar25 != 0xd00);
        fVar36 = fVar36 + fVar36;
        fVar44 = fVar44 + fVar44 + -1.0;
        goto LAB_014fbebb;
      }
      lVar25 = 0;
      do {
        uVar18 = *(undefined8 *)((long)local_1a80 + lVar25 + 8);
        puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar25 + -0x40);
        *puVar1 = *(undefined8 *)((long)local_1a80 + lVar25);
        puVar1[1] = uVar18;
        DynamicStackArray<float,_16UL,_64UL>::operator=
                  ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                   (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_1a40.arr + lVar25));
        uVar18 = *(undefined8 *)((long)local_19c0 + lVar25 + 8);
        pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                 ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar25);
        pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_19c0 + lVar25);
        *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
        uVar18 = *(undefined8 *)((long)local_19c0 + lVar25 + 0x18);
        *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_19c0 + lVar25 + 0x10);
        *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
        DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                  (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                          ((long)&aDStack_1980[0].arr[0].field_0 + lVar25));
        lVar25 = lVar25 + 0x340;
      } while (lVar25 != 0xd00);
      auVar41._0_4_ = fVar36 + fVar36 + -1.0;
      auVar41._4_4_ = fStack_34cc + fStack_34cc + -1.0;
      auVar41._8_4_ = 0xbf800000;
      auVar41._12_4_ = 0xbf800000;
    }
    else if (0.5 <= fVar36) {
      lVar25 = 0;
      do {
        uVar18 = *(undefined8 *)((long)local_2780 + lVar25 + 8);
        puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar25 + -0x40);
        *puVar1 = *(undefined8 *)((long)local_2780 + lVar25);
        puVar1[1] = uVar18;
        DynamicStackArray<float,_16UL,_64UL>::operator=
                  ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                   (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_2740.arr + lVar25));
        uVar18 = *(undefined8 *)((long)local_26c0 + lVar25 + 8);
        pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                 ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar25);
        pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_26c0 + lVar25);
        *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
        uVar18 = *(undefined8 *)((long)local_26c0 + lVar25 + 0x18);
        *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_26c0 + lVar25 + 0x10);
        *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
        DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                  (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                          ((long)&aDStack_2680[0].arr[0].field_0 + lVar25));
        lVar25 = lVar25 + 0x340;
      } while (lVar25 != 0xd00);
      fVar36 = fVar36 + fVar36 + -1.0;
      fVar44 = fVar44 + fVar44;
LAB_014fbebb:
      auVar41 = vinsertps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar44),0x10);
    }
    else {
      lVar25 = 0;
      do {
        uVar18 = *(undefined8 *)((long)&local_3480 + lVar25 + 8);
        puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar25 + -0x40);
        *puVar1 = *(undefined8 *)((long)&local_3480 + lVar25);
        puVar1[1] = uVar18;
        DynamicStackArray<float,_16UL,_64UL>::operator=
                  ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                   (DynamicStackArray<float,_16UL,_64UL> *)((long)&local_3440 + lVar25));
        uVar18 = *(undefined8 *)((long)&local_33c0 + lVar25 + 8);
        puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -4) + lVar25);
        *puVar1 = *(undefined8 *)((long)&local_33c0 + lVar25);
        puVar1[1] = uVar18;
        uVar18 = *(undefined8 *)((long)&local_33b0 + lVar25 + 8);
        puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -3) + lVar25);
        *puVar1 = *(undefined8 *)((long)&local_33b0 + lVar25);
        puVar1[1] = uVar18;
        DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                  ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar25),
                   (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&local_3380 + lVar25));
        lVar25 = lVar25 + 0x340;
      } while (lVar25 != 0xd00);
      auVar41._0_4_ = fVar36 + fVar36;
      auVar41._4_4_ = fStack_34cc + fStack_34cc;
      auVar41._8_8_ = 0;
    }
    aVar4 = (anon_union_8_2_4062524c_for_Vec2<float>_1)vmovlps_avx(auVar41);
    uv->field_0 = aVar4;
    local_34c0 = ZEXT416((uint)((float)local_34c0._0_4_ + (float)local_34c0._0_4_));
    depth = depth + 1;
    puVar31 = local_380;
    paVar27 = local_80;
    do {
      paVar27 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(paVar27->v + -0x340);
      lVar25 = -0xd00;
      puVar30 = puVar31;
      do {
        puVar7 = *(undefined1 **)(puVar30 + 0x2c0);
        if (puVar7 != (undefined1 *)0x0 && puVar30 + 0xc0 != puVar7) {
          alignedFree(puVar7);
        }
        puVar7 = *(undefined1 **)(puVar30 + 0x40);
        if (puVar7 != (undefined1 *)0x0 && puVar30 != puVar7) {
          operator_delete__(puVar7);
        }
        puVar30 = puVar30 + -0x340;
        lVar25 = lVar25 + 0x340;
      } while (lVar25 != 0);
      puVar31 = puVar31 + -0xd00;
    } while (paVar27 != &local_3480);
  }
  if (!(bool)(bVar32 & bVar15 & bVar33 & bVar34)) {
    GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
              ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,patch,
               border0,border1,border2,border3);
    fVar36 = (uv->field_0).field_0.x;
    fVar44 = (uv->field_0).field_0.y;
    pvVar8 = this->P;
    pvVar9 = this->dPdu;
    pvVar10 = this->dPdv;
    pvVar11 = this->ddPdudu;
    pvVar12 = this->ddPdvdv;
    pvVar13 = this->ddPdudv;
    auVar42 = ZEXT416((uint)fVar44);
    auVar37 = ZEXT416((uint)fVar36);
    if (pvVar8 != (vfloat_impl<4> *)0x0) {
      if ((((fVar44 == 1.0) && (!NAN(fVar44))) ||
          (((fVar36 == 0.0 && (!NAN(fVar36))) || ((fVar36 == 1.0 && (!NAN(fVar36))))))) ||
         ((fVar44 == 0.0 && (!NAN(fVar44))))) {
        local_3500._4_4_ = fStack_342c;
        local_3500._0_4_ = local_3430;
        uStack_34f8._4_4_ = fStack_3424;
        uStack_34f8._0_4_ = fStack_3428;
        fVar90 = local_3420;
        fVar91 = fStack_341c;
        fVar92 = fStack_3418;
        fVar93 = fStack_3414;
        fVar83 = local_33e0;
        fVar85 = fStack_33dc;
        fVar87 = fStack_33d8;
        fVar89 = fStack_33d4;
        fVar75 = local_33f0;
        fVar76 = fStack_33ec;
        fVar77 = fStack_33e8;
        fVar78 = fStack_33e4;
      }
      else {
        auVar38 = vshufps_avx(auVar37,auVar37,0);
        auVar49 = vshufps_avx(auVar42,auVar42,0);
        fVar90 = fVar36 + fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar90 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        local_3500._4_4_ =
             (auVar38._4_4_ * fStack_342c + auVar49._4_4_ * local_3380.v[1]) * auVar46._4_4_;
        local_3500._0_4_ =
             (auVar38._0_4_ * local_3430 + auVar49._0_4_ * local_3380.v[0]) * auVar46._0_4_;
        uStack_34f8._0_4_ =
             (auVar38._8_4_ * fStack_3428 + auVar49._8_4_ * local_3380.v[2]) * auVar46._8_4_;
        uStack_34f8._4_4_ =
             (auVar38._12_4_ * fStack_3424 + auVar49._12_4_ * local_3380.v[3]) * auVar46._12_4_;
        fVar90 = 1.0 - fVar36;
        auVar39 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
        fVar90 = fVar90 + fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar90 * auVar46._0_4_)));
        auVar50 = vshufps_avx(auVar46,auVar46,0);
        auVar40 = vshufps_avx(ZEXT416((uint)(1.0 - fVar44)),ZEXT416((uint)(1.0 - fVar44)),0);
        fVar90 = (2.0 - fVar36) - fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar90 * auVar46._0_4_)));
        auVar51 = vshufps_avx(auVar46,auVar46,0);
        fVar90 = (fVar36 + 1.0) - fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar90 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        fVar90 = auVar50._0_4_ * (auVar39._0_4_ * local_3370 + auVar49._0_4_ * local_3420);
        fVar91 = auVar50._4_4_ * (auVar39._4_4_ * fStack_336c + auVar49._4_4_ * fStack_341c);
        fVar92 = auVar50._8_4_ * (auVar39._8_4_ * fStack_3368 + auVar49._8_4_ * fStack_3418);
        fVar93 = auVar50._12_4_ * (auVar39._12_4_ * fStack_3364 + auVar49._12_4_ * fStack_3414);
        fVar83 = (auVar39._0_4_ * local_33e0 + auVar40._0_4_ * local_3350) * auVar51._0_4_;
        fVar85 = (auVar39._4_4_ * fStack_33dc + auVar40._4_4_ * fStack_334c) * auVar51._4_4_;
        fVar87 = (auVar39._8_4_ * fStack_33d8 + auVar40._8_4_ * fStack_3348) * auVar51._8_4_;
        fVar89 = (auVar39._12_4_ * fStack_33d4 + auVar40._12_4_ * fStack_3344) * auVar51._12_4_;
        fVar75 = (auVar40._0_4_ * local_33f0 + auVar38._0_4_ * local_3360) * auVar46._0_4_;
        fVar76 = (auVar40._4_4_ * fStack_33ec + auVar38._4_4_ * fStack_335c) * auVar46._4_4_;
        fVar77 = (auVar40._8_4_ * fStack_33e8 + auVar38._8_4_ * fStack_3358) * auVar46._8_4_;
        fVar78 = (auVar40._12_4_ * fStack_33e4 + auVar38._12_4_ * fStack_3354) * auVar46._12_4_;
      }
      fVar16 = 1.0 - fVar44;
      fVar45 = 1.0 - fVar36;
      auVar46 = ZEXT416((uint)(fVar16 * fVar16 * fVar16));
      auVar46 = vshufps_avx(auVar46,auVar46,0);
      auVar38 = ZEXT416((uint)(fVar45 * fVar45 * fVar45));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      auVar49 = ZEXT416((uint)(fVar36 * fVar36 * 3.0 * fVar45));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar39 = ZEXT416((uint)(fVar36 * fVar36 * fVar36));
      auVar39 = vshufps_avx(auVar39,auVar39,0);
      fVar60 = auVar39._0_4_;
      fVar57 = auVar39._4_4_;
      fVar59 = auVar39._8_4_;
      fVar61 = auVar39._12_4_;
      fVar81 = auVar49._0_4_;
      fVar82 = auVar49._4_4_;
      fVar56 = auVar49._8_4_;
      fVar58 = auVar49._12_4_;
      auVar49 = ZEXT416((uint)(fVar36 * 3.0 * fVar45 * fVar45));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      fVar45 = auVar49._0_4_;
      fVar47 = auVar49._4_4_;
      fVar48 = auVar49._8_4_;
      fVar84 = auVar49._12_4_;
      fVar86 = auVar38._0_4_;
      fVar88 = auVar38._4_4_;
      fVar79 = auVar38._8_4_;
      fVar80 = auVar38._12_4_;
      auVar38 = ZEXT416((uint)(fVar44 * 3.0 * fVar16 * fVar16));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      auVar49 = ZEXT416((uint)(fVar44 * fVar44 * 3.0 * fVar16));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar39 = ZEXT416((uint)(fVar44 * fVar44 * fVar44));
      auVar39 = vshufps_avx(auVar39,auVar39,0);
      (pvVar8->field_0).v[0] =
           auVar46._0_4_ *
           (fVar86 * local_3480.v[0] +
           fVar45 * local_3470 + fVar60 * local_3450 + fVar81 * local_3460) +
           auVar38._0_4_ *
           (fVar86 * local_3440.v[0] +
           fVar45 * (float)local_3500._0_4_ + fVar60 * local_3410 + fVar81 * fVar90) +
           auVar49._0_4_ *
           (fVar86 * local_3400 + fVar45 * fVar75 + fVar60 * local_33d0 + fVar81 * fVar83) +
           auVar39._0_4_ *
           (fVar86 * local_33c0.v[0] +
           fVar45 * local_33b0.v[0] + fVar81 * local_33a0 + fVar60 * local_3390);
      (pvVar8->field_0).v[1] =
           auVar46._4_4_ *
           (fVar88 * local_3480.v[1] +
           fVar47 * fStack_346c + fVar57 * fStack_344c + fVar82 * fStack_345c) +
           auVar38._4_4_ *
           (fVar88 * local_3440.v[1] +
           fVar47 * (float)local_3500._4_4_ + fVar57 * fStack_340c + fVar82 * fVar91) +
           auVar49._4_4_ *
           (fVar88 * fStack_33fc + fVar47 * fVar76 + fVar57 * fStack_33cc + fVar82 * fVar85) +
           auVar39._4_4_ *
           (fVar88 * local_33c0.v[1] +
           fVar47 * local_33b0.v[1] + fVar82 * fStack_339c + fVar57 * fStack_338c);
      (pvVar8->field_0).v[2] =
           auVar46._8_4_ *
           (fVar79 * local_3480.v[2] +
           fVar48 * fStack_3468 + fVar59 * fStack_3448 + fVar56 * fStack_3458) +
           auVar38._8_4_ *
           (fVar79 * local_3440.v[2] +
           fVar48 * (float)uStack_34f8 + fVar59 * fStack_3408 + fVar56 * fVar92) +
           auVar49._8_4_ *
           (fVar79 * fStack_33f8 + fVar48 * fVar77 + fVar59 * fStack_33c8 + fVar56 * fVar87) +
           auVar39._8_4_ *
           (fVar79 * local_33c0.v[2] +
           fVar48 * local_33b0.v[2] + fVar56 * fStack_3398 + fVar59 * fStack_3388);
      (pvVar8->field_0).v[3] =
           auVar46._12_4_ *
           (fVar80 * local_3480.v[3] +
           fVar84 * fStack_3464 + fVar61 * fStack_3444 + fVar58 * fStack_3454) +
           auVar38._12_4_ *
           (fVar80 * local_3440.v[3] +
           fVar84 * uStack_34f8._4_4_ + fVar61 * fStack_3404 + fVar58 * fVar93) +
           auVar49._12_4_ *
           (fVar80 * fStack_33f4 + fVar84 * fVar78 + fVar61 * fStack_33c4 + fVar58 * fVar89) +
           auVar39._12_4_ *
           (fVar80 * local_33c0.v[3] +
           fVar84 * local_33b0.v[3] + fVar58 * fStack_3394 + fVar61 * fStack_3384);
    }
    if (pvVar9 != (vfloat_impl<4> *)0x0) {
      auVar46 = vcmpps_avx(auVar37,SUB6416(ZEXT464(0x3f800000),0),0);
      auVar38 = vcmpps_avx(auVar37,ZEXT816(0) << 0x40,0);
      auVar46 = vorps_avx(auVar38,auVar46);
      if ((fVar44 == 1.0 || fVar44 == 0.0) ||
          (auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_34f0._4_4_ = fStack_33ec;
        local_34f0._0_4_ = local_33f0;
        uStack_34e8._0_4_ = fStack_33e8;
        uStack_34e8._4_4_ = fStack_33e4;
        fVar90 = local_3430;
        fVar91 = fStack_342c;
        fVar92 = fStack_3428;
        fVar93 = fStack_3424;
        fVar83 = local_3420;
        fVar85 = fStack_341c;
        fVar87 = fStack_3418;
        fVar89 = fStack_3414;
        fVar75 = local_33e0;
        fVar76 = fStack_33dc;
        fVar77 = fStack_33d8;
        fVar78 = fStack_33d4;
      }
      else {
        auVar49 = vshufps_avx(auVar37,auVar37,0);
        auVar39 = vshufps_avx(auVar42,auVar42,0);
        fVar90 = fVar36 + fVar44;
        auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - auVar38._0_4_ * fVar90)));
        auVar50 = vshufps_avx(auVar38,auVar38,0);
        fVar90 = 1.0 - fVar36;
        auVar40 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
        fVar90 = fVar90 + fVar44;
        auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar90 * auVar38._0_4_)));
        auVar51 = vshufps_avx(auVar38,auVar38,0);
        auVar41 = vshufps_avx(ZEXT416((uint)(1.0 - fVar44)),ZEXT416((uint)(1.0 - fVar44)),0);
        fVar90 = (2.0 - fVar36) - fVar44;
        auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar90 * auVar38._0_4_)));
        auVar17 = vshufps_avx(auVar38,auVar38,0);
        fVar90 = (fVar36 + 1.0) - fVar44;
        auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - auVar38._0_4_ * fVar90)));
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        local_34f0._4_4_ =
             (auVar41._4_4_ * fStack_33ec + auVar49._4_4_ * fStack_335c) * auVar38._4_4_;
        local_34f0._0_4_ = (auVar41._0_4_ * local_33f0 + auVar49._0_4_ * local_3360) * auVar38._0_4_
        ;
        uStack_34e8._0_4_ =
             (auVar41._8_4_ * fStack_33e8 + auVar49._8_4_ * fStack_3358) * auVar38._8_4_;
        uStack_34e8._4_4_ =
             (auVar41._12_4_ * fStack_33e4 + auVar49._12_4_ * fStack_3354) * auVar38._12_4_;
        fVar90 = (local_3430 * auVar49._0_4_ + auVar39._0_4_ * local_3380.v[0]) * auVar50._0_4_;
        fVar91 = (fStack_342c * auVar49._4_4_ + auVar39._4_4_ * local_3380.v[1]) * auVar50._4_4_;
        fVar92 = (fStack_3428 * auVar49._8_4_ + auVar39._8_4_ * local_3380.v[2]) * auVar50._8_4_;
        fVar93 = (fStack_3424 * auVar49._12_4_ + auVar39._12_4_ * local_3380.v[3]) * auVar50._12_4_;
        fVar83 = auVar51._0_4_ * (auVar40._0_4_ * local_3370 + local_3420 * auVar39._0_4_);
        fVar85 = auVar51._4_4_ * (auVar40._4_4_ * fStack_336c + fStack_341c * auVar39._4_4_);
        fVar87 = auVar51._8_4_ * (auVar40._8_4_ * fStack_3368 + fStack_3418 * auVar39._8_4_);
        fVar89 = auVar51._12_4_ * (auVar40._12_4_ * fStack_3364 + fStack_3414 * auVar39._12_4_);
        fVar75 = auVar17._0_4_ * (auVar41._0_4_ * local_3350 + auVar40._0_4_ * local_33e0);
        fVar76 = auVar17._4_4_ * (auVar41._4_4_ * fStack_334c + auVar40._4_4_ * fStack_33dc);
        fVar77 = auVar17._8_4_ * (auVar41._8_4_ * fStack_3348 + auVar40._8_4_ * fStack_33d8);
        fVar78 = auVar17._12_4_ * (auVar41._12_4_ * fStack_3344 + auVar40._12_4_ * fStack_33d4);
      }
      fVar88 = 1.0 - fVar36;
      fVar86 = 1.0 - fVar44;
      fVar45 = fVar88 * fVar88;
      fVar16 = fVar36 * fVar88 + fVar36 * fVar88;
      fVar47 = fVar36 * fVar36;
      fVar48 = fVar47 * 3.0;
      fVar84 = fVar86 * fVar86;
      auVar38 = ZEXT416((uint)((fVar16 - fVar47) * 3.0));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      auVar49 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
      fVar79 = auVar49._0_4_;
      fVar80 = auVar49._4_4_;
      fVar81 = auVar49._8_4_;
      fVar82 = auVar49._12_4_;
      fVar59 = auVar38._0_4_;
      fVar61 = auVar38._4_4_;
      fVar62 = auVar38._8_4_;
      fVar63 = auVar38._12_4_;
      auVar38 = ZEXT416((uint)((fVar45 - fVar16) * 3.0));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      fVar64 = auVar38._0_4_;
      fVar65 = auVar38._4_4_;
      fVar66 = auVar38._8_4_;
      fVar67 = auVar38._12_4_;
      auVar38 = vshufps_avx(ZEXT416((uint)(fVar45 * -3.0)),ZEXT416((uint)(fVar45 * -3.0)),0);
      fVar56 = auVar38._0_4_;
      fVar58 = auVar38._4_4_;
      fVar60 = auVar38._8_4_;
      fVar57 = auVar38._12_4_;
      auVar38 = vshufps_avx(ZEXT416((uint)(fVar86 * fVar84)),ZEXT416((uint)(fVar86 * fVar84)),0);
      fVar16 = fVar44 * fVar44;
      auVar49 = ZEXT416((uint)(fVar44 * 3.0 * fVar84));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar39 = ZEXT416((uint)(fVar86 * fVar16 * 3.0));
      auVar39 = vshufps_avx(auVar39,auVar39,0);
      auVar50 = vshufps_avx(ZEXT416((uint)(fVar44 * fVar16)),ZEXT416((uint)(fVar44 * fVar16)),0);
      auVar40 = vpermilps_avx(local_34c0,0);
      (pvVar9->field_0).v[0] =
           auVar40._0_4_ *
           (auVar38._0_4_ *
            (fVar56 * local_3480.v[0] +
            fVar64 * local_3470 + fVar79 * local_3450 + fVar59 * local_3460) +
           auVar49._0_4_ *
           (fVar56 * local_3440.v[0] + fVar64 * fVar90 + fVar59 * fVar83 + fVar79 * local_3410) +
           auVar50._0_4_ *
           (fVar56 * local_33c0.v[0] +
           fVar64 * local_33b0.v[0] + fVar79 * local_3390 + fVar59 * local_33a0) +
           auVar39._0_4_ *
           (fVar56 * local_3400 +
           fVar64 * (float)local_34f0._0_4_ + fVar59 * fVar75 + fVar79 * local_33d0));
      (pvVar9->field_0).v[1] =
           auVar40._4_4_ *
           (auVar38._4_4_ *
            (fVar58 * local_3480.v[1] +
            fVar65 * fStack_346c + fVar80 * fStack_344c + fVar61 * fStack_345c) +
           auVar49._4_4_ *
           (fVar58 * local_3440.v[1] + fVar65 * fVar91 + fVar61 * fVar85 + fVar80 * fStack_340c) +
           auVar50._4_4_ *
           (fVar58 * local_33c0.v[1] +
           fVar65 * local_33b0.v[1] + fVar80 * fStack_338c + fVar61 * fStack_339c) +
           auVar39._4_4_ *
           (fVar58 * fStack_33fc +
           fVar65 * (float)local_34f0._4_4_ + fVar61 * fVar76 + fVar80 * fStack_33cc));
      (pvVar9->field_0).v[2] =
           auVar40._8_4_ *
           (auVar38._8_4_ *
            (fVar60 * local_3480.v[2] +
            fVar66 * fStack_3468 + fVar81 * fStack_3448 + fVar62 * fStack_3458) +
           auVar49._8_4_ *
           (fVar60 * local_3440.v[2] + fVar66 * fVar92 + fVar62 * fVar87 + fVar81 * fStack_3408) +
           auVar50._8_4_ *
           (fVar60 * local_33c0.v[2] +
           fVar66 * local_33b0.v[2] + fVar81 * fStack_3388 + fVar62 * fStack_3398) +
           auVar39._8_4_ *
           (fVar60 * fStack_33f8 +
           fVar66 * (float)uStack_34e8 + fVar62 * fVar77 + fVar81 * fStack_33c8));
      (pvVar9->field_0).v[3] =
           auVar40._12_4_ *
           (auVar38._12_4_ *
            (fVar57 * local_3480.v[3] +
            fVar67 * fStack_3464 + fVar82 * fStack_3444 + fVar63 * fStack_3454) +
           auVar49._12_4_ *
           (fVar57 * local_3440.v[3] + fVar67 * fVar93 + fVar63 * fVar89 + fVar82 * fStack_3404) +
           auVar50._12_4_ *
           (fVar57 * local_33c0.v[3] +
           fVar67 * local_33b0.v[3] + fVar82 * fStack_3384 + fVar63 * fStack_3394) +
           auVar39._12_4_ *
           (fVar57 * fStack_33f4 +
           fVar67 * uStack_34e8._4_4_ + fVar63 * fVar78 + fVar82 * fStack_33c4));
      fVar90 = local_3430;
      fVar91 = fStack_342c;
      fVar92 = fStack_3428;
      fVar93 = fStack_3424;
      fVar83 = local_3420;
      fVar85 = fStack_341c;
      fVar87 = fStack_3418;
      fVar89 = fStack_3414;
      fVar75 = local_33f0;
      fVar76 = fStack_33ec;
      fVar77 = fStack_33e8;
      fVar78 = fStack_33e4;
      fVar79 = local_33e0;
      fVar80 = fStack_33dc;
      fVar81 = fStack_33d8;
      fVar82 = fStack_33d4;
      if ((fVar44 != 1.0 && fVar44 != 0.0) &&
          (auVar46 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar38 = vshufps_avx(auVar37,auVar37,0);
        auVar49 = vshufps_avx(auVar42,auVar42,0);
        fVar90 = fVar36 + fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar90 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),0);
        fVar90 = (auVar38._0_4_ * local_3430 + auVar49._0_4_ * local_3380.v[0]) * auVar46._0_4_;
        fVar91 = (auVar38._4_4_ * fStack_342c + auVar49._4_4_ * local_3380.v[1]) * auVar46._4_4_;
        fVar92 = (auVar38._8_4_ * fStack_3428 + auVar49._8_4_ * local_3380.v[2]) * auVar46._8_4_;
        fVar93 = (auVar38._12_4_ * fStack_3424 + auVar49._12_4_ * local_3380.v[3]) * auVar46._12_4_;
        fVar83 = fVar88 + fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar83 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        fVar83 = (local_3420 * auVar49._0_4_ + auVar39._0_4_ * local_3370) * auVar46._0_4_;
        fVar85 = (fStack_341c * auVar49._4_4_ + auVar39._4_4_ * fStack_336c) * auVar46._4_4_;
        fVar87 = (fStack_3418 * auVar49._8_4_ + auVar39._8_4_ * fStack_3368) * auVar46._8_4_;
        fVar89 = (fStack_3414 * auVar49._12_4_ + auVar39._12_4_ * fStack_3364) * auVar46._12_4_;
        auVar49 = vshufps_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),0);
        fVar75 = (2.0 - fVar36) - fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar75 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        fVar79 = (auVar39._0_4_ * local_33e0 + auVar49._0_4_ * local_3350) * auVar46._0_4_;
        fVar80 = (auVar39._4_4_ * fStack_33dc + auVar49._4_4_ * fStack_334c) * auVar46._4_4_;
        fVar81 = (auVar39._8_4_ * fStack_33d8 + auVar49._8_4_ * fStack_3348) * auVar46._8_4_;
        fVar82 = (auVar39._12_4_ * fStack_33d4 + auVar49._12_4_ * fStack_3344) * auVar46._12_4_;
        fVar75 = (fVar36 + 1.0) - fVar44;
        auVar46 = vrcpss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        auVar46 = ZEXT416((uint)(auVar46._0_4_ * (2.0 - fVar75 * auVar46._0_4_)));
        auVar46 = vshufps_avx(auVar46,auVar46,0);
        fVar75 = (local_33f0 * auVar49._0_4_ + auVar38._0_4_ * local_3360) * auVar46._0_4_;
        fVar76 = (fStack_33ec * auVar49._4_4_ + auVar38._4_4_ * fStack_335c) * auVar46._4_4_;
        fVar77 = (fStack_33e8 * auVar49._8_4_ + auVar38._8_4_ * fStack_3358) * auVar46._8_4_;
        fVar78 = (fStack_33e4 * auVar49._12_4_ + auVar38._12_4_ * fStack_3354) * auVar46._12_4_;
      }
      fVar86 = fVar44 * fVar86 + fVar44 * fVar86;
      auVar46 = vshufps_avx(ZEXT416((uint)(fVar88 * fVar45)),ZEXT416((uint)(fVar88 * fVar45)),0);
      auVar38 = vshufps_avx(ZEXT416((uint)(fVar88 * fVar48)),ZEXT416((uint)(fVar88 * fVar48)),0);
      auVar49 = vshufps_avx(ZEXT416((uint)(fVar36 * fVar47)),ZEXT416((uint)(fVar36 * fVar47)),0);
      fVar64 = auVar49._0_4_;
      fVar65 = auVar49._4_4_;
      fVar66 = auVar49._8_4_;
      fVar67 = auVar49._12_4_;
      fVar56 = auVar38._0_4_;
      fVar58 = auVar38._4_4_;
      fVar60 = auVar38._8_4_;
      fVar57 = auVar38._12_4_;
      auVar38 = ZEXT416((uint)(fVar36 * 3.0 * fVar45));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      fVar59 = auVar38._0_4_;
      fVar61 = auVar38._4_4_;
      fVar62 = auVar38._8_4_;
      fVar63 = auVar38._12_4_;
      fVar45 = auVar46._0_4_;
      fVar47 = auVar46._4_4_;
      fVar48 = auVar46._8_4_;
      fVar88 = auVar46._12_4_;
      auVar46 = vshufps_avx(ZEXT416((uint)(fVar84 * -3.0)),ZEXT416((uint)(fVar84 * -3.0)),0);
      auVar38 = ZEXT416((uint)((fVar84 - fVar86) * 3.0));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      auVar49 = ZEXT416((uint)((fVar86 - fVar16) * 3.0));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar39 = vpermilps_avx(ZEXT416((uint)(fVar16 * 3.0)),0);
      (pvVar10->field_0).v[0] =
           (auVar46._0_4_ *
            (fVar45 * local_3480.v[0] +
            fVar59 * local_3470 + fVar56 * local_3460 + fVar64 * local_3450) +
           auVar38._0_4_ *
           (fVar45 * local_3440.v[0] + fVar90 * fVar59 + fVar83 * fVar56 + fVar64 * local_3410) +
           (fVar45 * local_3400 + fVar75 * fVar59 + fVar79 * fVar56 + fVar64 * local_33d0) *
           auVar49._0_4_ +
           auVar39._0_4_ *
           (fVar45 * local_33c0.v[0] +
           fVar59 * local_33b0.v[0] + fVar64 * local_3390 + fVar56 * local_33a0)) * auVar40._0_4_;
      (pvVar10->field_0).v[1] =
           (auVar46._4_4_ *
            (fVar47 * local_3480.v[1] +
            fVar61 * fStack_346c + fVar58 * fStack_345c + fVar65 * fStack_344c) +
           auVar38._4_4_ *
           (fVar47 * local_3440.v[1] + fVar91 * fVar61 + fVar85 * fVar58 + fVar65 * fStack_340c) +
           (fVar47 * fStack_33fc + fVar76 * fVar61 + fVar80 * fVar58 + fVar65 * fStack_33cc) *
           auVar49._4_4_ +
           auVar39._4_4_ *
           (fVar47 * local_33c0.v[1] +
           fVar61 * local_33b0.v[1] + fVar65 * fStack_338c + fVar58 * fStack_339c)) * auVar40._4_4_;
      (pvVar10->field_0).v[2] =
           (auVar46._8_4_ *
            (fVar48 * local_3480.v[2] +
            fVar62 * fStack_3468 + fVar60 * fStack_3458 + fVar66 * fStack_3448) +
           auVar38._8_4_ *
           (fVar48 * local_3440.v[2] + fVar92 * fVar62 + fVar87 * fVar60 + fVar66 * fStack_3408) +
           (fVar48 * fStack_33f8 + fVar77 * fVar62 + fVar81 * fVar60 + fVar66 * fStack_33c8) *
           auVar49._8_4_ +
           auVar39._8_4_ *
           (fVar48 * local_33c0.v[2] +
           fVar62 * local_33b0.v[2] + fVar66 * fStack_3388 + fVar60 * fStack_3398)) * auVar40._8_4_;
      (pvVar10->field_0).v[3] =
           (auVar46._12_4_ *
            (fVar88 * local_3480.v[3] +
            fVar63 * fStack_3464 + fVar57 * fStack_3454 + fVar67 * fStack_3444) +
           auVar38._12_4_ *
           (fVar88 * local_3440.v[3] + fVar93 * fVar63 + fVar89 * fVar57 + fVar67 * fStack_3404) +
           (fVar88 * fStack_33f4 + fVar78 * fVar63 + fVar82 * fVar57 + fVar67 * fStack_33c4) *
           auVar49._12_4_ +
           auVar39._12_4_ *
           (fVar88 * local_33c0.v[3] +
           fVar63 * local_33b0.v[3] + fVar67 * fStack_3384 + fVar57 * fStack_3394)) * auVar40._12_4_
      ;
    }
    if (pvVar11 == (vfloat_impl<4> *)0x0) {
      return;
    }
    auVar46 = vcmpps_avx(auVar37,SUB6416(ZEXT464(0x3f800000),0),0);
    auVar38 = vcmpps_avx(auVar37,ZEXT816(0) << 0x40,0);
    auVar46 = vorps_avx(auVar38,auVar46);
    bVar14 = fVar44 == 0.0;
    bVar15 = fVar44 == 1.0;
    if ((bVar15 || bVar14) || (auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_3500._4_4_ = fStack_33ec;
      local_3500._0_4_ = local_33f0;
      uStack_34f8._0_4_ = fStack_33e8;
      uStack_34f8._4_4_ = fStack_33e4;
      fVar90 = local_3430;
      fVar91 = fStack_342c;
      fVar92 = fStack_3428;
      fVar93 = fStack_3424;
      fVar83 = local_3420;
      fVar85 = fStack_341c;
      fVar87 = fStack_3418;
      fVar89 = fStack_3414;
      fVar75 = local_33e0;
      fVar76 = fStack_33dc;
      fVar77 = fStack_33d8;
      fVar78 = fStack_33d4;
    }
    else {
      auVar49 = vshufps_avx(auVar37,auVar37,0);
      auVar39 = vshufps_avx(auVar42,auVar42,0);
      fVar90 = fVar36 + fVar44;
      auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - auVar38._0_4_ * fVar90)));
      auVar50 = vshufps_avx(auVar38,auVar38,0);
      fVar90 = 1.0 - fVar36;
      auVar40 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
      fVar90 = fVar90 + fVar44;
      auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar90 * auVar38._0_4_)));
      auVar51 = vshufps_avx(auVar38,auVar38,0);
      auVar41 = vshufps_avx(ZEXT416((uint)(1.0 - fVar44)),ZEXT416((uint)(1.0 - fVar44)),0);
      fVar90 = (2.0 - fVar36) - fVar44;
      auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar90 * auVar38._0_4_)));
      auVar17 = vshufps_avx(auVar38,auVar38,0);
      fVar90 = (fVar36 + 1.0) - fVar44;
      auVar38 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar90 * auVar38._0_4_)));
      auVar38 = vshufps_avx(auVar38,auVar38,0);
      local_3500._4_4_ = (auVar41._4_4_ * fStack_33ec + auVar49._4_4_ * fStack_335c) * auVar38._4_4_
      ;
      local_3500._0_4_ = (auVar41._0_4_ * local_33f0 + auVar49._0_4_ * local_3360) * auVar38._0_4_;
      uStack_34f8._0_4_ =
           (auVar41._8_4_ * fStack_33e8 + auVar49._8_4_ * fStack_3358) * auVar38._8_4_;
      uStack_34f8._4_4_ =
           (auVar41._12_4_ * fStack_33e4 + auVar49._12_4_ * fStack_3354) * auVar38._12_4_;
      fVar90 = (auVar39._0_4_ * local_3380.v[0] + local_3430 * auVar49._0_4_) * auVar50._0_4_;
      fVar91 = (auVar39._4_4_ * local_3380.v[1] + fStack_342c * auVar49._4_4_) * auVar50._4_4_;
      fVar92 = (auVar39._8_4_ * local_3380.v[2] + fStack_3428 * auVar49._8_4_) * auVar50._8_4_;
      fVar93 = (auVar39._12_4_ * local_3380.v[3] + fStack_3424 * auVar49._12_4_) * auVar50._12_4_;
      fVar83 = auVar51._0_4_ * (auVar40._0_4_ * local_3370 + local_3420 * auVar39._0_4_);
      fVar85 = auVar51._4_4_ * (auVar40._4_4_ * fStack_336c + fStack_341c * auVar39._4_4_);
      fVar87 = auVar51._8_4_ * (auVar40._8_4_ * fStack_3368 + fStack_3418 * auVar39._8_4_);
      fVar89 = auVar51._12_4_ * (auVar40._12_4_ * fStack_3364 + fStack_3414 * auVar39._12_4_);
      fVar75 = auVar17._0_4_ * (auVar41._0_4_ * local_3350 + auVar40._0_4_ * local_33e0);
      fVar76 = auVar17._4_4_ * (auVar41._4_4_ * fStack_334c + auVar40._4_4_ * fStack_33dc);
      fVar77 = auVar17._8_4_ * (auVar41._8_4_ * fStack_3348 + auVar40._8_4_ * fStack_33d8);
      fVar78 = auVar17._12_4_ * (auVar41._12_4_ * fStack_3344 + auVar40._12_4_ * fStack_33d4);
    }
    fVar48 = 1.0 - fVar36;
    fVar47 = 1.0 - fVar44;
    auVar51 = ZEXT416((uint)fVar48);
    fVar16 = fVar47 * fVar47;
    auVar38 = vshufps_avx(ZEXT416((uint)(fVar47 * fVar16)),ZEXT416((uint)(fVar47 * fVar16)),0);
    auVar49 = ZEXT416((uint)((fVar48 - (fVar36 + fVar36)) * 6.0));
    auVar49 = vshufps_avx(auVar49,auVar49,0);
    auVar39 = vshufps_avx(ZEXT416((uint)(fVar36 * 6.0)),ZEXT416((uint)(fVar36 * 6.0)),0);
    fVar65 = auVar39._0_4_;
    fVar66 = auVar39._4_4_;
    fVar67 = auVar39._8_4_;
    fVar68 = auVar39._12_4_;
    fVar61 = auVar49._0_4_;
    fVar62 = auVar49._4_4_;
    fVar63 = auVar49._8_4_;
    fVar64 = auVar49._12_4_;
    auVar49 = ZEXT416((uint)((fVar36 - (fVar48 + fVar48)) * 6.0));
    auVar49 = vshufps_avx(auVar49,auVar49,0);
    fVar58 = auVar49._0_4_;
    fVar60 = auVar49._4_4_;
    fVar57 = auVar49._8_4_;
    fVar59 = auVar49._12_4_;
    auVar49 = vshufps_avx(ZEXT416((uint)(fVar48 * 6.0)),ZEXT416((uint)(fVar48 * 6.0)),0);
    fVar84 = auVar49._0_4_;
    fVar86 = auVar49._4_4_;
    fVar88 = auVar49._8_4_;
    fVar79 = auVar49._12_4_;
    fVar45 = fVar44 * fVar44;
    auVar49 = ZEXT416((uint)(fVar44 * 3.0 * fVar16));
    auVar49 = vshufps_avx(auVar49,auVar49,0);
    auVar39 = ZEXT416((uint)(fVar45 * 3.0 * fVar47));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar50 = vshufps_avx(ZEXT416((uint)(fVar45 * fVar44)),ZEXT416((uint)(fVar45 * fVar44)),0);
    auVar40 = vshufps_avx(ZEXT416((uint)((float)local_34c0._0_4_ * (float)local_34c0._0_4_)),
                          ZEXT416((uint)((float)local_34c0._0_4_ * (float)local_34c0._0_4_)),0);
    fVar80 = auVar40._0_4_;
    fVar81 = auVar40._4_4_;
    fVar82 = auVar40._8_4_;
    fVar56 = auVar40._12_4_;
    (pvVar11->field_0).v[0] =
         fVar80 * (auVar38._0_4_ *
                   (fVar84 * local_3480.v[0] +
                   fVar58 * local_3470 + fVar65 * local_3450 + fVar61 * local_3460) +
                  auVar49._0_4_ *
                  (fVar84 * local_3440.v[0] +
                  fVar90 * fVar58 + fVar61 * fVar83 + fVar65 * local_3410) +
                  auVar39._0_4_ *
                  (fVar84 * local_3400 +
                  fVar58 * (float)local_3500._0_4_ + fVar65 * local_33d0 + fVar61 * fVar75) +
                  auVar50._0_4_ *
                  (fVar84 * local_33c0.v[0] +
                  fVar58 * local_33b0.v[0] + fVar61 * local_33a0 + fVar65 * local_3390));
    (pvVar11->field_0).v[1] =
         fVar81 * (auVar38._4_4_ *
                   (fVar86 * local_3480.v[1] +
                   fVar60 * fStack_346c + fVar66 * fStack_344c + fVar62 * fStack_345c) +
                  auVar49._4_4_ *
                  (fVar86 * local_3440.v[1] +
                  fVar91 * fVar60 + fVar62 * fVar85 + fVar66 * fStack_340c) +
                  auVar39._4_4_ *
                  (fVar86 * fStack_33fc +
                  fVar60 * (float)local_3500._4_4_ + fVar66 * fStack_33cc + fVar62 * fVar76) +
                  auVar50._4_4_ *
                  (fVar86 * local_33c0.v[1] +
                  fVar60 * local_33b0.v[1] + fVar62 * fStack_339c + fVar66 * fStack_338c));
    (pvVar11->field_0).v[2] =
         fVar82 * (auVar38._8_4_ *
                   (fVar88 * local_3480.v[2] +
                   fVar57 * fStack_3468 + fVar67 * fStack_3448 + fVar63 * fStack_3458) +
                  auVar49._8_4_ *
                  (fVar88 * local_3440.v[2] +
                  fVar92 * fVar57 + fVar63 * fVar87 + fVar67 * fStack_3408) +
                  auVar39._8_4_ *
                  (fVar88 * fStack_33f8 +
                  fVar57 * (float)uStack_34f8 + fVar67 * fStack_33c8 + fVar63 * fVar77) +
                  auVar50._8_4_ *
                  (fVar88 * local_33c0.v[2] +
                  fVar57 * local_33b0.v[2] + fVar63 * fStack_3398 + fVar67 * fStack_3388));
    (pvVar11->field_0).v[3] =
         fVar56 * (auVar38._12_4_ *
                   (fVar79 * local_3480.v[3] +
                   fVar59 * fStack_3464 + fVar68 * fStack_3444 + fVar64 * fStack_3454) +
                  auVar49._12_4_ *
                  (fVar79 * local_3440.v[3] +
                  fVar93 * fVar59 + fVar64 * fVar89 + fVar68 * fStack_3404) +
                  auVar39._12_4_ *
                  (fVar79 * fStack_33f4 +
                  fVar59 * uStack_34f8._4_4_ + fVar68 * fStack_33c4 + fVar64 * fVar78) +
                  auVar50._12_4_ *
                  (fVar79 * local_33c0.v[3] +
                  fVar59 * local_33b0.v[3] + fVar64 * fStack_3394 + fVar68 * fStack_3384));
    auVar38 = ZEXT416((uint)fVar47);
    fVar90 = local_3430;
    fVar91 = fStack_342c;
    fVar92 = fStack_3428;
    fVar93 = fStack_3424;
    fVar83 = local_3420;
    fVar85 = fStack_341c;
    fVar87 = fStack_3418;
    fVar89 = fStack_3414;
    fVar75 = local_33f0;
    fVar76 = fStack_33ec;
    fVar77 = fStack_33e8;
    fVar78 = fStack_33e4;
    fVar84 = local_33e0;
    fVar86 = fStack_33dc;
    fVar88 = fStack_33d8;
    fVar79 = fStack_33d4;
    if ((!bVar15 && !bVar14) && (auVar46 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      auVar39 = vshufps_avx(auVar37,auVar37,0);
      auVar50 = vshufps_avx(auVar42,auVar42,0);
      fVar90 = fVar36 + fVar44;
      auVar49 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar49 = ZEXT416((uint)(auVar49._0_4_ * (2.0 - auVar49._0_4_ * fVar90)));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar40 = vshufps_avx(auVar51,auVar51,0);
      fVar90 = auVar49._0_4_ * (auVar39._0_4_ * local_3430 + auVar50._0_4_ * local_3380.v[0]);
      fVar91 = auVar49._4_4_ * (auVar39._4_4_ * fStack_342c + auVar50._4_4_ * local_3380.v[1]);
      fVar92 = auVar49._8_4_ * (auVar39._8_4_ * fStack_3428 + auVar50._8_4_ * local_3380.v[2]);
      fVar93 = auVar49._12_4_ * (auVar39._12_4_ * fStack_3424 + auVar50._12_4_ * local_3380.v[3]);
      fVar83 = fVar48 + fVar44;
      auVar49 = vrcpss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
      auVar49 = ZEXT416((uint)(auVar49._0_4_ * (2.0 - fVar83 * auVar49._0_4_)));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      fVar83 = auVar49._0_4_ * (auVar40._0_4_ * local_3370 + local_3420 * auVar50._0_4_);
      fVar85 = auVar49._4_4_ * (auVar40._4_4_ * fStack_336c + fStack_341c * auVar50._4_4_);
      fVar87 = auVar49._8_4_ * (auVar40._8_4_ * fStack_3368 + fStack_3418 * auVar50._8_4_);
      fVar89 = auVar49._12_4_ * (auVar40._12_4_ * fStack_3364 + fStack_3414 * auVar50._12_4_);
      auVar50 = vshufps_avx(auVar38,auVar38,0);
      fVar75 = (2.0 - fVar36) - fVar44;
      auVar49 = vrcpss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
      auVar49 = ZEXT416((uint)(auVar49._0_4_ * (2.0 - fVar75 * auVar49._0_4_)));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      fVar84 = auVar49._0_4_ * (auVar50._0_4_ * local_3350 + auVar40._0_4_ * local_33e0);
      fVar86 = auVar49._4_4_ * (auVar50._4_4_ * fStack_334c + auVar40._4_4_ * fStack_33dc);
      fVar88 = auVar49._8_4_ * (auVar50._8_4_ * fStack_3348 + auVar40._8_4_ * fStack_33d8);
      fVar79 = auVar49._12_4_ * (auVar50._12_4_ * fStack_3344 + auVar40._12_4_ * fStack_33d4);
      fVar75 = (fVar36 + 1.0) - fVar44;
      auVar49 = vrcpss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
      auVar49 = ZEXT416((uint)(auVar49._0_4_ * (2.0 - auVar49._0_4_ * fVar75)));
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      fVar75 = (auVar50._0_4_ * local_33f0 + auVar39._0_4_ * local_3360) * auVar49._0_4_;
      fVar76 = (auVar50._4_4_ * fStack_33ec + auVar39._4_4_ * fStack_335c) * auVar49._4_4_;
      fVar77 = (auVar50._8_4_ * fStack_33e8 + auVar39._8_4_ * fStack_3358) * auVar49._8_4_;
      fVar78 = (auVar50._12_4_ * fStack_33e4 + auVar39._12_4_ * fStack_3354) * auVar49._12_4_;
    }
    fVar58 = fVar48 * fVar48;
    fVar60 = fVar36 * fVar36;
    auVar49 = ZEXT416((uint)(fVar48 * fVar60 * 3.0));
    auVar49 = vshufps_avx(auVar49,auVar49,0);
    auVar39 = vshufps_avx(ZEXT416((uint)(fVar60 * fVar36)),ZEXT416((uint)(fVar60 * fVar36)),0);
    fVar63 = auVar39._0_4_;
    fVar64 = auVar39._4_4_;
    fVar65 = auVar39._8_4_;
    fVar66 = auVar39._12_4_;
    fVar57 = auVar49._0_4_;
    fVar59 = auVar49._4_4_;
    fVar61 = auVar49._8_4_;
    fVar62 = auVar49._12_4_;
    auVar49 = ZEXT416((uint)(fVar58 * fVar36 * 3.0));
    auVar49 = vshufps_avx(auVar49,auVar49,0);
    fVar67 = auVar49._0_4_;
    fVar68 = auVar49._4_4_;
    fVar69 = auVar49._8_4_;
    fVar70 = auVar49._12_4_;
    auVar49 = vshufps_avx(ZEXT416((uint)(fVar58 * fVar48)),ZEXT416((uint)(fVar58 * fVar48)),0);
    fVar71 = auVar49._0_4_;
    fVar72 = auVar49._4_4_;
    fVar73 = auVar49._8_4_;
    fVar74 = auVar49._12_4_;
    auVar49 = vshufps_avx(ZEXT416((uint)(fVar47 * 6.0)),ZEXT416((uint)(fVar47 * 6.0)),0);
    auVar39 = ZEXT416((uint)((fVar44 - (fVar47 + fVar47)) * 6.0));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar50 = ZEXT416((uint)((fVar47 - (fVar44 + fVar44)) * 6.0));
    auVar50 = vshufps_avx(auVar50,auVar50,0);
    auVar40 = vshufps_avx(ZEXT416((uint)(fVar44 * 6.0)),ZEXT416((uint)(fVar44 * 6.0)),0);
    (pvVar12->field_0).v[0] =
         (auVar49._0_4_ *
          (fVar71 * local_3480.v[0] +
          fVar67 * local_3470 + fVar63 * local_3450 + fVar57 * local_3460) +
         auVar39._0_4_ *
         (fVar71 * local_3440.v[0] + fVar83 * fVar57 + fVar63 * local_3410 + fVar67 * fVar90) +
         auVar50._0_4_ *
         (fVar71 * local_3400 + fVar67 * fVar75 + fVar84 * fVar57 + fVar63 * local_33d0) +
         auVar40._0_4_ *
         (fVar71 * local_33c0.v[0] +
         fVar67 * local_33b0.v[0] + fVar63 * local_3390 + fVar57 * local_33a0)) * fVar80;
    (pvVar12->field_0).v[1] =
         (auVar49._4_4_ *
          (fVar72 * local_3480.v[1] +
          fVar68 * fStack_346c + fVar64 * fStack_344c + fVar59 * fStack_345c) +
         auVar39._4_4_ *
         (fVar72 * local_3440.v[1] + fVar85 * fVar59 + fVar64 * fStack_340c + fVar68 * fVar91) +
         auVar50._4_4_ *
         (fVar72 * fStack_33fc + fVar68 * fVar76 + fVar86 * fVar59 + fVar64 * fStack_33cc) +
         auVar40._4_4_ *
         (fVar72 * local_33c0.v[1] +
         fVar68 * local_33b0.v[1] + fVar64 * fStack_338c + fVar59 * fStack_339c)) * fVar81;
    (pvVar12->field_0).v[2] =
         (auVar49._8_4_ *
          (fVar73 * local_3480.v[2] +
          fVar69 * fStack_3468 + fVar65 * fStack_3448 + fVar61 * fStack_3458) +
         auVar39._8_4_ *
         (fVar73 * local_3440.v[2] + fVar87 * fVar61 + fVar65 * fStack_3408 + fVar69 * fVar92) +
         auVar50._8_4_ *
         (fVar73 * fStack_33f8 + fVar69 * fVar77 + fVar88 * fVar61 + fVar65 * fStack_33c8) +
         auVar40._8_4_ *
         (fVar73 * local_33c0.v[2] +
         fVar69 * local_33b0.v[2] + fVar65 * fStack_3388 + fVar61 * fStack_3398)) * fVar82;
    (pvVar12->field_0).v[3] =
         (auVar49._12_4_ *
          (fVar74 * local_3480.v[3] +
          fVar70 * fStack_3464 + fVar66 * fStack_3444 + fVar62 * fStack_3454) +
         auVar39._12_4_ *
         (fVar74 * local_3440.v[3] + fVar89 * fVar62 + fVar66 * fStack_3404 + fVar70 * fVar93) +
         auVar50._12_4_ *
         (fVar74 * fStack_33f4 + fVar70 * fVar78 + fVar79 * fVar62 + fVar66 * fStack_33c4) +
         auVar40._12_4_ *
         (fVar74 * local_33c0.v[3] +
         fVar70 * local_33b0.v[3] + fVar66 * fStack_3384 + fVar62 * fStack_3394)) * fVar56;
    if ((!bVar15 && !bVar14) && (auVar46 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      auVar37 = vshufps_avx(auVar37,auVar37,0);
      auVar46 = vshufps_avx(auVar42,auVar42,0);
      fVar90 = fVar36 + fVar44;
      auVar42 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar42 = ZEXT416((uint)(auVar42._0_4_ * (2.0 - auVar42._0_4_ * fVar90)));
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      auVar49 = vshufps_avx(auVar51,auVar51,0);
      local_3430 = (local_3430 * auVar37._0_4_ + auVar46._0_4_ * local_3380.v[0]) * auVar42._0_4_;
      fStack_342c = (fStack_342c * auVar37._4_4_ + auVar46._4_4_ * local_3380.v[1]) * auVar42._4_4_;
      fStack_3428 = (fStack_3428 * auVar37._8_4_ + auVar46._8_4_ * local_3380.v[2]) * auVar42._8_4_;
      fStack_3424 = (fStack_3424 * auVar37._12_4_ + auVar46._12_4_ * local_3380.v[3]) *
                    auVar42._12_4_;
      fVar90 = fVar48 + fVar44;
      auVar42 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar42 = ZEXT416((uint)(auVar42._0_4_ * (2.0 - fVar90 * auVar42._0_4_)));
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      local_3420 = auVar42._0_4_ * (auVar49._0_4_ * local_3370 + local_3420 * auVar46._0_4_);
      fStack_341c = auVar42._4_4_ * (auVar49._4_4_ * fStack_336c + fStack_341c * auVar46._4_4_);
      fStack_3418 = auVar42._8_4_ * (auVar49._8_4_ * fStack_3368 + fStack_3418 * auVar46._8_4_);
      fStack_3414 = auVar42._12_4_ * (auVar49._12_4_ * fStack_3364 + fStack_3414 * auVar46._12_4_);
      auVar46 = vshufps_avx(auVar38,auVar38,0);
      fVar90 = (2.0 - fVar36) - fVar44;
      auVar42 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar42 = ZEXT416((uint)(auVar42._0_4_ * (2.0 - fVar90 * auVar42._0_4_)));
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      local_33e0 = auVar42._0_4_ * (auVar46._0_4_ * local_3350 + auVar49._0_4_ * local_33e0);
      fStack_33dc = auVar42._4_4_ * (auVar46._4_4_ * fStack_334c + auVar49._4_4_ * fStack_33dc);
      fStack_33d8 = auVar42._8_4_ * (auVar46._8_4_ * fStack_3348 + auVar49._8_4_ * fStack_33d8);
      fStack_33d4 = auVar42._12_4_ * (auVar46._12_4_ * fStack_3344 + auVar49._12_4_ * fStack_33d4);
      fVar90 = (fVar36 + 1.0) - fVar44;
      auVar42 = vrcpss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      auVar42 = ZEXT416((uint)(auVar42._0_4_ * (2.0 - auVar42._0_4_ * fVar90)));
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      local_33f0 = (local_33f0 * auVar46._0_4_ + auVar37._0_4_ * local_3360) * auVar42._0_4_;
      fStack_33ec = (fStack_33ec * auVar46._4_4_ + auVar37._4_4_ * fStack_335c) * auVar42._4_4_;
      fStack_33e8 = (fStack_33e8 * auVar46._8_4_ + auVar37._8_4_ * fStack_3358) * auVar42._8_4_;
      fStack_33e4 = (fStack_33e4 * auVar46._12_4_ + auVar37._12_4_ * fStack_3354) * auVar42._12_4_;
    }
    fVar36 = fVar36 * fVar48 + fVar36 * fVar48;
    fVar44 = fVar44 * fVar47 + fVar44 * fVar47;
    auVar42 = vshufps_avx(ZEXT416((uint)(fVar16 * -3.0)),ZEXT416((uint)(fVar16 * -3.0)),0);
    auVar37 = vshufps_avx(ZEXT416((uint)(fVar58 * -3.0)),ZEXT416((uint)(fVar58 * -3.0)),0);
    auVar46 = ZEXT416((uint)((fVar58 - fVar36) * 3.0));
    auVar46 = vshufps_avx(auVar46,auVar46,0);
    auVar38 = ZEXT416((uint)((fVar36 - fVar60) * 3.0));
    auVar38 = vshufps_avx(auVar38,auVar38,0);
    auVar49 = vpermilps_avx(ZEXT416((uint)(fVar60 * 3.0)),0);
    fVar78 = auVar49._0_4_;
    fVar47 = auVar49._4_4_;
    fVar48 = auVar49._8_4_;
    fVar84 = auVar49._12_4_;
    fVar89 = auVar38._0_4_;
    fVar75 = auVar38._4_4_;
    fVar76 = auVar38._8_4_;
    fVar77 = auVar38._12_4_;
    fVar93 = auVar46._0_4_;
    fVar83 = auVar46._4_4_;
    fVar85 = auVar46._8_4_;
    fVar87 = auVar46._12_4_;
    fVar36 = auVar37._0_4_;
    fVar90 = auVar37._4_4_;
    fVar91 = auVar37._8_4_;
    fVar92 = auVar37._12_4_;
    auVar37 = ZEXT416((uint)((fVar16 - fVar44) * 3.0));
    auVar37 = vshufps_avx(auVar37,auVar37,0);
    auVar46 = ZEXT416((uint)((fVar44 - fVar45) * 3.0));
    auVar46 = vshufps_avx(auVar46,auVar46,0);
    auVar38 = vpermilps_avx(ZEXT416((uint)(fVar45 * 3.0)),0);
    (pvVar13->field_0).v[0] =
         (auVar42._0_4_ *
          (fVar36 * local_3480.v[0] +
          fVar93 * local_3470 + fVar89 * local_3460 + fVar78 * local_3450) +
         auVar37._0_4_ *
         (fVar36 * local_3440.v[0] + local_3430 * fVar93 + local_3420 * fVar89 + fVar78 * local_3410
         ) + auVar46._0_4_ *
             (fVar36 * local_3400 + local_33f0 * fVar93 + fVar78 * local_33d0 + fVar89 * local_33e0)
             + auVar38._0_4_ *
               (fVar36 * local_33c0.v[0] +
               fVar93 * local_33b0.v[0] + fVar78 * local_3390 + fVar89 * local_33a0)) * fVar80;
    (pvVar13->field_0).v[1] =
         (auVar42._4_4_ *
          (fVar90 * local_3480.v[1] +
          fVar83 * fStack_346c + fVar75 * fStack_345c + fVar47 * fStack_344c) +
         auVar37._4_4_ *
         (fVar90 * local_3440.v[1] +
         fStack_342c * fVar83 + fStack_341c * fVar75 + fVar47 * fStack_340c) +
         auVar46._4_4_ *
         (fVar90 * fStack_33fc + fStack_33ec * fVar83 + fVar47 * fStack_33cc + fVar75 * fStack_33dc)
         + auVar38._4_4_ *
           (fVar90 * local_33c0.v[1] +
           fVar83 * local_33b0.v[1] + fVar47 * fStack_338c + fVar75 * fStack_339c)) * fVar81;
    (pvVar13->field_0).v[2] =
         (auVar42._8_4_ *
          (fVar91 * local_3480.v[2] +
          fVar85 * fStack_3468 + fVar76 * fStack_3458 + fVar48 * fStack_3448) +
         auVar37._8_4_ *
         (fVar91 * local_3440.v[2] +
         fStack_3428 * fVar85 + fStack_3418 * fVar76 + fVar48 * fStack_3408) +
         auVar46._8_4_ *
         (fVar91 * fStack_33f8 + fStack_33e8 * fVar85 + fVar48 * fStack_33c8 + fVar76 * fStack_33d8)
         + auVar38._8_4_ *
           (fVar91 * local_33c0.v[2] +
           fVar85 * local_33b0.v[2] + fVar48 * fStack_3388 + fVar76 * fStack_3398)) * fVar82;
    (pvVar13->field_0).v[3] =
         (auVar42._12_4_ *
          (fVar92 * local_3480.v[3] +
          fVar87 * fStack_3464 + fVar77 * fStack_3454 + fVar84 * fStack_3444) +
         auVar37._12_4_ *
         (fVar92 * local_3440.v[3] +
         fStack_3424 * fVar87 + fStack_3414 * fVar77 + fVar84 * fStack_3404) +
         auVar46._12_4_ *
         (fVar92 * fStack_33f4 + fStack_33e4 * fVar87 + fVar84 * fStack_33c4 + fVar77 * fStack_33d4)
         + auVar38._12_4_ *
           (fVar92 * local_33c0.v[3] +
           fVar87 * local_33b0.v[3] + fVar84 * fStack_3384 + fVar77 * fStack_3394)) * fVar56;
    return;
  }
LAB_014fd036:
  BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
            ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
             (EVP_PKEY_CTX *)patch);
  BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
            ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
             (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
             this->ddPdudu,this->ddPdvdv,this->ddPdudv,(float)local_34c0._0_4_);
  return;
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }